

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O1

void __thiscall lzham::lzham_decompressor::reset_arith_tables(lzham_decompressor *this)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar4;
  
  auVar1 = _DAT_001170b0;
  lVar2 = 0;
  auVar3 = _DAT_00117090;
  auVar5 = _DAT_001170a0;
  do {
    auVar6 = auVar5 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffff4) {
      this->m_is_match_model[lVar2].m_bit_0_prob = 0x400;
      this->m_is_match_model[lVar2 + 1].m_bit_0_prob = 0x400;
    }
    auVar6 = auVar3 ^ auVar1;
    if (auVar6._4_4_ == -0x80000000 && auVar6._0_4_ < -0x7ffffff4) {
      this->m_is_match_model[lVar2 + 2].m_bit_0_prob = 0x400;
      this->m_is_match_model[lVar2 + 3].m_bit_0_prob = 0x400;
    }
    lVar2 = lVar2 + 4;
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 4;
    auVar5._8_8_ = lVar4 + 4;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 4;
    auVar3._8_8_ = lVar4 + 4;
  } while (lVar2 != 0xc);
  lVar2 = -0xc;
  do {
    this->m_is_rep0_model[lVar2].m_bit_0_prob = 0x400;
    this->m_is_rep0_single_byte_model[lVar2].m_bit_0_prob = 0x400;
    this->m_is_rep1_model[lVar2].m_bit_0_prob = 0x400;
    this->m_is_rep2_model[lVar2].m_bit_0_prob = 0x400;
    this->m_is_rep2_model[lVar2 + 0xc].m_bit_0_prob = 0x400;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void lzham_decompressor::reset_arith_tables()
   {
      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_is_match_model); i++)
         m_is_match_model[i].clear();

      for (uint i = 0; i < CLZDecompBase::cNumStates; i++)
      {
         m_is_rep_model[i].clear();
         m_is_rep0_model[i].clear();
         m_is_rep0_single_byte_model[i].clear();
         m_is_rep1_model[i].clear();
         m_is_rep2_model[i].clear();
      }
   }